

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::visitBlock(wasm::Block__
          (void *this,Block *curr)

{
  Break *this_00;
  Expression **ppEVar1;
  Expression *ast;
  bool bVar2;
  Expression *pEVar3;
  Unary *this_01;
  Expression *pEVar4;
  ulong uVar5;
  Binary *this_02;
  Drop *this_03;
  Nop *output;
  ulong uVar6;
  Break *this_04;
  Expression *pEVar7;
  uint uVar8;
  ulong uVar9;
  EffectAnalyzer local_1b8;
  Expression *local_48;
  Block *local_40;
  void *local_38;
  
  if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0) {
    uVar8 = 1;
    uVar6 = 0;
    local_40 = curr;
    local_38 = this;
    do {
      pEVar3 = (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [uVar6];
      if ((pEVar3->_id == IfId) && (this_04 = *(Break **)(pEVar3 + 2), this_04 != (Break *)0x0)) {
        this_00 = (Break *)pEVar3[1].type.id;
        if (((this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id ==
             BreakId) && (this_00->condition == (Expression *)0x0)) {
          pEVar7 = pEVar3 + 2;
          bVar2 = canTurnIfIntoBrIf(*(Expression **)(pEVar3 + 1),this_00->value,
                                    *(PassOptions **)((long)this + 0xe0),
                                    *(Module **)((long)this + 0xd0));
          if (!bVar2) {
            this_04 = *(Break **)pEVar7;
            curr = local_40;
            this = local_38;
            goto LAB_0088d127;
          }
          this_00->condition = *(Expression **)(pEVar3 + 1);
          Break::finalize(this_00);
          local_1b8._0_8_ = *(undefined8 *)((long)local_38 + 0xd0);
          pEVar3 = Builder::dropIfConcretelyTyped((Builder *)&local_1b8,(Expression *)this_00);
          if ((local_40->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar6) goto LAB_0088d4ff;
          (local_40->list).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar6] =
               pEVar3;
LAB_0088d201:
          ExpressionManipulator::spliceIntoBlock(local_40,uVar8,*(Expression **)pEVar7);
          curr = local_40;
          this = local_38;
        }
        else {
LAB_0088d127:
          if (((this_04->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id ==
               BreakId) && (this_04->condition == (Expression *)0x0)) {
            bVar2 = canTurnIfIntoBrIf(*(Expression **)(pEVar3 + 1),this_04->value,
                                      *(PassOptions **)((long)this + 0xe0),
                                      *(Module **)((long)this + 0xd0));
            curr = local_40;
            this = local_38;
            if (bVar2) {
              local_48 = *(Expression **)(pEVar3 + 1);
              this_01 = (Unary *)MixedArena::allocSpace
                                           ((MixedArena *)(*(long *)((long)local_38 + 0xd0) + 0x158)
                                            ,0x20,8);
              (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id =
                   UnaryId;
              (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id
                   = 0;
              this_01->op = EqZInt32;
              this_01->value = local_48;
              Unary::finalize(this_01);
              this_04->condition = (Expression *)this_01;
              Break::finalize(this_04);
              local_1b8._0_8_ = *(undefined8 *)((long)local_38 + 0xd0);
              pEVar4 = Builder::dropIfConcretelyTyped((Builder *)&local_1b8,(Expression *)this_04);
              if (uVar6 < (local_40->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements) {
                pEVar7 = (Expression *)&pEVar3[1].type;
                (local_40->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                [uVar6] = pEVar4;
                goto LAB_0088d201;
              }
              goto LAB_0088d4ff;
            }
          }
        }
      }
      uVar6 = (ulong)uVar8;
      uVar5 = (curr->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      uVar8 = uVar8 + 1;
    } while (uVar6 < uVar5);
    if (1 < uVar5) {
      uVar8 = 1;
      uVar6 = 0;
      do {
        if (uVar5 <= uVar6) {
LAB_0088d4ff:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        ppEVar1 = (curr->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
        pEVar3 = ppEVar1[uVar6];
        uVar9 = (ulong)uVar8;
        if (((pEVar3->_id == BreakId) &&
            (pEVar7 = (Expression *)pEVar3[2].type.id, pEVar7 != (Expression *)0x0)) &&
           ((pEVar3->type).id != 1)) {
          if (*(long *)(pEVar3 + 2) != 0) {
            __assert_fail("!br1->value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                          ,0x3c3,
                          "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::visitBlock(Block *)"
                         );
          }
          if (uVar5 <= uVar9) goto LAB_0088d4ff;
          pEVar4 = ppEVar1[uVar9];
          if ((pEVar4->_id == BreakId) && (pEVar3[1].type.id == pEVar4[1].type.id)) {
            if (*(long *)(pEVar4 + 2) != 0) {
              __assert_fail("!br2->value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                            ,0x3c8,
                            "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::visitBlock(Block *)"
                           );
            }
            ast = (Expression *)pEVar4[2].type.id;
            if (ast == (Expression *)0x0) {
              this_03 = (Drop *)MixedArena::allocSpace
                                          ((MixedArena *)(*(long *)((long)this + 0xd0) + 0x158),0x18
                                           ,8);
              (this_03->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
                   DropId;
              (this_03->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id
                   = 0;
              this_03->value = pEVar7;
              Drop::finalize(this_03);
              if ((local_40->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements <= uVar6) goto LAB_0088d4ff;
              (local_40->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar6]
                   = (Expression *)this_03;
              curr = local_40;
              this = local_38;
            }
            else if ((*(char *)((long)this + 0xd8) == '\x01') && ((pEVar4->type).id != 1)) {
              EffectAnalyzer::EffectAnalyzer
                        (&local_1b8,*(PassOptions **)((long)this + 0xe0),
                         *(Module **)((long)this + 0xd0),ast);
              bVar2 = true;
              if (((((local_1b8.trap == false) &&
                    (((local_1b8.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
                      && (local_1b8.danglingPop == false)) &&
                     (local_1b8.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
                     )))) && (((local_1b8.writesMemory == false && (local_1b8.writesTable == false))
                              && (local_1b8.writesStruct == false)))) &&
                  ((local_1b8.writesArray == false && (local_1b8.isAtomic == false)))) &&
                 ((local_1b8.calls == false &&
                  (((local_1b8.throws_ == false &&
                    (local_1b8.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
                    )) && (local_1b8.branchesOut == false)))))) {
                bVar2 = local_1b8.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0
                ;
              }
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree(&local_1b8.delegateTargets._M_t);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree(&local_1b8.breakTargets._M_t);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree(&local_1b8.globalsWritten._M_t);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree(&local_1b8.mutableGlobalsRead._M_t);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree(&local_1b8.localsWritten._M_t);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree(&local_1b8.localsRead._M_t);
              if (local_1b8.funcEffectsMap.
                  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1b8.funcEffectsMap.
                           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              curr = local_40;
              this = local_38;
              if (!bVar2) {
                local_48 = (Expression *)pEVar3[2].type.id;
                pEVar7 = (Expression *)pEVar4[2].type.id;
                this_02 = (Binary *)
                          MixedArena::allocSpace
                                    ((MixedArena *)(*(long *)((long)local_38 + 0xd0) + 0x158),0x28,8
                                    );
                (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                     BinaryId;
                (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.
                id = 0;
                this_02->op = OrInt32;
                this_02->left = local_48;
                this_02->right = pEVar7;
                Binary::finalize(this_02);
                pEVar3[2].type.id = (uintptr_t)this_02;
                pEVar4->_id = NopId;
                (pEVar4->type).id = 0;
                curr = local_40;
                this = local_38;
              }
            }
          }
        }
        uVar5 = (curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
        uVar8 = uVar8 + 1;
        uVar6 = uVar9;
      } while (uVar9 < uVar5 - 1);
      tablify(wasm::Block__(this,curr);
      restructureIf(wasm::Block__(this,curr);
    }
  }
  return;
}

Assistant:

void visitBlock(Block* curr) {
        // if a block has an if br else br, we can un-conditionalize the latter,
        // allowing the if to become a br_if.
        // * note that if not in a block already, then we need to create a block
        //   for this, so not useful otherwise
        // * note that this only happens at the end of a block, as code after
        //   the if is dead
        // * note that we do this at the end, because un-conditionalizing can
        //   interfere with optimizeLoop()ing.
        auto& list = curr->list;
        for (Index i = 0; i < list.size(); i++) {
          auto* iff = list[i]->dynCast<If>();
          if (!iff || !iff->ifFalse) {
            // if it lacked an if-false, it would already be a br_if, as that's
            // the easy case
            continue;
          }
          auto* ifTrueBreak = iff->ifTrue->dynCast<Break>();
          if (ifTrueBreak && !ifTrueBreak->condition &&
              canTurnIfIntoBrIf(iff->condition,
                                ifTrueBreak->value,
                                passOptions,
                                *getModule())) {
            // we are an if-else where the ifTrue is a break without a
            // condition, so we can do this
            ifTrueBreak->condition = iff->condition;
            ifTrueBreak->finalize();
            list[i] = Builder(*getModule()).dropIfConcretelyTyped(ifTrueBreak);
            ExpressionManipulator::spliceIntoBlock(curr, i + 1, iff->ifFalse);
            continue;
          }
          // otherwise, perhaps we can flip the if
          auto* ifFalseBreak = iff->ifFalse->dynCast<Break>();
          if (ifFalseBreak && !ifFalseBreak->condition &&
              canTurnIfIntoBrIf(iff->condition,
                                ifFalseBreak->value,
                                passOptions,
                                *getModule())) {
            ifFalseBreak->condition =
              Builder(*getModule()).makeUnary(EqZInt32, iff->condition);
            ifFalseBreak->finalize();
            list[i] = Builder(*getModule()).dropIfConcretelyTyped(ifFalseBreak);
            ExpressionManipulator::spliceIntoBlock(curr, i + 1, iff->ifTrue);
            continue;
          }
        }
        if (list.size() >= 2) {
          // combine/optimize adjacent br_ifs + a br (maybe _if) right after it
          for (Index i = 0; i < list.size() - 1; i++) {
            auto* br1 = list[i]->dynCast<Break>();
            // avoid unreachable brs, as they are dead code anyhow, and after
            // merging them the outer scope could need type changes
            if (!br1 || !br1->condition || br1->type == Type::unreachable) {
              continue;
            }
            assert(!br1->value);
            auto* br2 = list[i + 1]->dynCast<Break>();
            if (!br2 || br1->name != br2->name) {
              continue;
            }
            assert(!br2->value); // same target as previous, which has no value
            // a br_if and then a br[_if] with the same target right after it
            if (br2->condition) {
              if (shrink && br2->type != Type::unreachable) {
                // Join adjacent br_ifs to the same target, making one br_if
                // with a "selectified" condition that executes both.
                if (!EffectAnalyzer(passOptions, *getModule(), br2->condition)
                       .hasSideEffects()) {
                  // it's ok to execute them both, do it
                  Builder builder(*getModule());
                  br1->condition =
                    builder.makeBinary(OrInt32, br1->condition, br2->condition);
                  ExpressionManipulator::nop(br2);
                }
              }
            } else {
              // merge, we go there anyhow
              Builder builder(*getModule());
              list[i] = builder.makeDrop(br1->condition);
            }
          }
          // Combine adjacent br_ifs that test the same value into a br_table,
          // when that makes sense.
          tablify(curr);
          // Pattern-patch ifs, recreating them when it makes sense.
          restructureIf(curr);
        }
      }